

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O2

iterator __thiscall
Common::
BijectionMap<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::insert(BijectionMap<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,Instruction *key,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  size_t *psVar1;
  mapped_type mVar2;
  size_t sVar3;
  size_t sVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  undefined1 auStack_58 [40];
  
  sVar3 = findKey(this,key);
  sVar4 = ((long)(this->data).
                 super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->data).
                super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  if (sVar3 == sVar4) {
    sVar3 = findValue(this,val);
    sVar4 = ((long)(this->data).
                   super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->data).
                  super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x28;
    if (sVar3 == sVar4) {
      psVar1 = (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur == psVar1) {
        mVar2 = this->currcount;
        pmVar5 = std::
                 map<ICM::Instruction::Instruction,_unsigned_long,_std::less<ICM::Instruction::Instruction>,_std::allocator<std::pair<const_ICM::Instruction::Instruction,_unsigned_long>_>_>
                 ::operator[](&this->keymap,key);
        *pmVar5 = mVar2;
        mVar2 = this->currcount;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](&this->valmap,val);
        *pmVar5 = mVar2;
        std::
        pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)auStack_58,key,val);
        std::
        vector<std::pair<ICM::Instruction::Instruction,std::__cxx11::string>,std::allocator<std::pair<ICM::Instruction::Instruction,std::__cxx11::string>>>
        ::emplace_back<std::pair<ICM::Instruction::Instruction,std::__cxx11::string>>
                  ((vector<std::pair<ICM::Instruction::Instruction,std::__cxx11::string>,std::allocator<std::pair<ICM::Instruction::Instruction,std::__cxx11::string>>>
                    *)&this->data,
                   (pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)auStack_58);
        std::__cxx11::string::~string((string *)(auStack_58 + 8));
        sVar4 = this->currcount;
        this->currcount = sVar4 + 1;
      }
      else {
        sVar4 = *psVar1;
        pmVar5 = std::
                 map<ICM::Instruction::Instruction,_unsigned_long,_std::less<ICM::Instruction::Instruction>,_std::allocator<std::pair<const_ICM::Instruction::Instruction,_unsigned_long>_>_>
                 ::operator[](&this->keymap,key);
        *pmVar5 = sVar4;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](&this->valmap,val);
        *pmVar5 = sVar4;
        std::
        pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)auStack_58,key,val);
        std::
        pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=((this->data).
                    super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + sVar4,(type)auStack_58);
        std::__cxx11::string::~string((string *)(auStack_58 + 8));
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&this->destroyable);
      }
    }
  }
  iVar6.count = sVar4;
  iVar6.data = this;
  return iVar6;
}

Assistant:

iterator insert(const _KTy &key, const _VTy &val) {
		if (findKey(key) != size() || findValue(val) != size()) {
			return end();
		}

		iterator result(this);
		if (destroyable.empty()) {
			keymap[key] = currcount;
			valmap[val] = currcount;
			data.push_back(std::make_pair(key, val));
			result = iterator(this, currcount);
			currcount++;
		}
		else {
			size_t id = destroyable.front();
			keymap[key] = id;
			valmap[val] = id;
			data[id] = std::make_pair(key, val);
			result = iterator(this, id);
			destroyable.pop_front();
		}
		return result;
	}